

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase59::run(TestCase59 *this)

{
  bool bVar1;
  Exception *pEVar2;
  anon_class_1_0_00000001 *in_RDX;
  ArrayPtr<const_char> AVar3;
  AddFailureAdapter local_248;
  ArrayPtr<const_char> local_230;
  bool local_219;
  undefined1 auStack_218 [7];
  bool _kj_shouldLog;
  size_t local_210;
  char (*local_208) [20];
  undefined1 local_200 [8];
  DebugComparison<const_char_(&)[20],_kj::StringPtr> _kjCondition;
  Exception *ex;
  Exception *_ex64;
  undefined1 local_1a8 [8];
  Maybe<kj::Exception> e;
  TestCase59 *this_local;
  
  e.ptr.field_1.value.details.builder.disposer = (ArrayDisposer *)this;
  runCatchingExceptions<kj::_::(anonymous_namespace)::TestCase59::run()::__0>
            ((Maybe<kj::Exception> *)local_1a8,(kj *)((long)&_ex64 + 7),in_RDX);
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1a8);
  if (pEVar2 == (Exception *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x43);
    AddFailureAdapter::operator<<(&local_248,(char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter(&local_248);
  }
  else {
    _kjCondition._40_8_ = pEVar2;
    local_208 = (char (*) [20])
                DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                           (char (*) [20])"std::exception: foo");
    _auStack_218 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)_kjCondition._40_8_)
    ;
    DebugExpression<char_const(&)[20]>::operator==
              ((DebugComparison<const_char_(&)[20],_kj::StringPtr> *)local_200,
               (DebugExpression<char_const(&)[20]> *)&local_208,(StringPtr *)auStack_218);
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
    if (!bVar1) {
      local_219 = Debug::shouldLog(ERROR);
      while (local_219 != false) {
        AVar3 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)_kjCondition._40_8_);
        local_230 = AVar3;
        Debug::
        log<char_const(&)[66],kj::_::DebugComparison<char_const(&)[20],kj::StringPtr>&,char_const(&)[20],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                   ,0x41,ERROR,
                   "\"failed: expected \" \"(\\\"std::exception: foo\\\") == (ex.getDescription())\", _kjCondition, \"std::exception: foo\", ex.getDescription()"
                   ,(char (*) [66])
                    "failed: expected (\"std::exception: foo\") == (ex.getDescription())",
                   (DebugComparison<const_char_(&)[20],_kj::StringPtr> *)local_200,
                   (char (*) [20])"std::exception: foo",(StringPtr *)&local_230);
        local_219 = false;
      }
    }
  }
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_1a8);
  return;
}

Assistant:

TEST(Exception, RunCatchingExceptionsStdException) {
  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    throw std::logic_error("foo");
  });

  KJ_IF_SOME(ex, e) {
    EXPECT_EQ("std::exception: foo", ex.getDescription());
  } else {
    ADD_FAILURE() << "Expected exception";
  }